

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool cmDependsFortran::ModulesDiffer(char *modFile,char *stampFile,char *compilerId)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  char local_4ba [2];
  int seqlen_1;
  char seq_1 [2];
  int seqlen;
  char seq [1];
  __mbstate_t local_4a8;
  char local_49e;
  char local_49d;
  undefined4 local_49c;
  bool okay;
  uchar hdr [2];
  long lStack_498;
  ifstream finStampFile;
  long local_290;
  ifstream finModFile;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  char *local_28;
  char *compilerId_local;
  char *stampFile_local;
  char *modFile_local;
  
  local_28 = compilerId;
  compilerId_local = stampFile;
  stampFile_local = modFile;
  iVar4 = strcmp(compilerId,"SunPro");
  pcVar1 = stampFile_local;
  if (iVar4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    pcVar1 = compilerId_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,pcVar1,&local_81);
    modFile_local._7_1_ = cmsys::SystemTools::FilesDiffer(&local_48,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    goto LAB_0077928d;
  }
  std::ifstream::ifstream(&local_290,stampFile_local,_S_in);
  std::ifstream::ifstream(&stack0xfffffffffffffb68,compilerId_local,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_290 + *(long *)(local_290 + -0x18)));
  if (((bVar2 & 1) != 0) ||
     (bVar2 = std::ios::operator!((ios *)((long)&stack0xfffffffffffffb68 +
                                         *(long *)(lStack_498 + -0x18))), (bVar2 & 1) != 0)) {
    modFile_local._7_1_ = 1;
    goto LAB_00779265;
  }
  iVar4 = strcmp(local_28,"GNU");
  if (iVar4 == 0) {
    plVar5 = (long *)std::istream::read((char *)&local_290,(long)&local_49e);
    bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&seqlen,0);
    std::istream::seekg(&local_290,_seqlen,local_4a8);
    if (((bVar3) && (local_49e == '\x1f')) && (local_49d == -0x75)) goto LAB_00779220;
    seq_1[1] = '\n';
    seqlen_1 = 1;
    bVar3 = cmFortranStreamContainsSequence((istream *)&local_290,seq_1 + 1,1);
    if (bVar3) {
      bVar3 = cmFortranStreamContainsSequence((istream *)&stack0xfffffffffffffb68,seq_1 + 1,1);
      if (bVar3) goto LAB_00779220;
      modFile_local._7_1_ = 1;
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,local_28);
      poVar6 = std::operator<<(poVar6," fortran module ");
      poVar6 = std::operator<<(poVar6,stampFile_local);
      poVar6 = std::operator<<(poVar6," has unexpected format.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      modFile_local._7_1_ = 1;
    }
  }
  else {
    iVar4 = strcmp(local_28,"Intel");
    if (iVar4 == 0) {
      local_4ba[0] = '\n';
      local_4ba[1] = '\0';
      bVar3 = cmFortranStreamContainsSequence((istream *)&local_290,local_4ba,2);
      if (bVar3) {
        bVar3 = cmFortranStreamContainsSequence((istream *)&stack0xfffffffffffffb68,local_4ba,2);
        if (bVar3) goto LAB_00779220;
        modFile_local._7_1_ = 1;
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,local_28);
        poVar6 = std::operator<<(poVar6," fortran module ");
        poVar6 = std::operator<<(poVar6,stampFile_local);
        poVar6 = std::operator<<(poVar6," has unexpected format.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        modFile_local._7_1_ = 1;
      }
      goto LAB_00779265;
    }
LAB_00779220:
    bVar3 = cmFortranStreamsDiffer((istream *)&local_290,(istream *)&stack0xfffffffffffffb68);
    if (bVar3) {
      modFile_local._7_1_ = 1;
    }
    else {
      modFile_local._7_1_ = 0;
    }
  }
LAB_00779265:
  local_49c = 1;
  std::ifstream::~ifstream(&stack0xfffffffffffffb68);
  std::ifstream::~ifstream(&local_290);
LAB_0077928d:
  return (bool)(modFile_local._7_1_ & 1);
}

Assistant:

bool cmDependsFortran::ModulesDiffer(const char* modFile,
                                     const char* stampFile,
                                     const char* compilerId)
{
  /*
  gnu >= 4.9:
    A mod file is an ascii file compressed with gzip.
    Compiling twice produces identical modules.

  gnu < 4.9:
    A mod file is an ascii file.
    <bar.mod>
    FORTRAN module created from /path/to/foo.f90 on Sun Dec 30 22:47:58 2007
    If you edit this, you'll get what you deserve.
    ...
    </bar.mod>
    As you can see the first line contains the date.

  intel:
    A mod file is a binary file.
    However, looking into both generated bar.mod files with a hex editor
    shows that they differ only before a sequence linefeed-zero (0x0A 0x00)
    which is located some bytes in front of the absoulte path to the source
    file.

  sun:
    A mod file is a binary file.  Compiling twice produces identical modules.

  others:
    TODO ...
  */


  /* Compilers which do _not_ produce different mod content when the same
   * source is compiled twice
   *   -SunPro
   */
  if(strcmp(compilerId, "SunPro") == 0)
    {
    return cmSystemTools::FilesDiffer(modFile, stampFile);
    }

#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream finModFile(modFile, std::ios::in | std::ios::binary);
  cmsys::ifstream finStampFile(stampFile, std::ios::in | std::ios::binary);
#else
  cmsys::ifstream finModFile(modFile, std::ios::in);
  cmsys::ifstream finStampFile(stampFile, std::ios::in);
#endif
  if(!finModFile || !finStampFile)
    {
    // At least one of the files does not exist.  The modules differ.
    return true;
    }

  /* Compilers which _do_ produce different mod content when the same
   * source is compiled twice
   *   -GNU
   *   -Intel
   *
   * Eat the stream content until all recompile only related changes
   * are left behind.
   */
  if (strcmp(compilerId, "GNU") == 0 )
    {
    // GNU Fortran 4.9 and later compress .mod files with gzip
    // but also do not include a date so we can fall through to
    // compare them without skipping any prefix.
    unsigned char hdr[2];
    bool okay = finModFile.read(reinterpret_cast<char*>(hdr), 2)? true:false;
    finModFile.seekg(0);
    if(!(okay && hdr[0] == 0x1f && hdr[1] == 0x8b))
      {
      const char seq[1] = {'\n'};
      const int seqlen = 1;

      if(!cmFortranStreamContainsSequence(finModFile, seq, seqlen))
        {
        // The module is of unexpected format.  Assume it is different.
        std::cerr << compilerId << " fortran module " << modFile
                  << " has unexpected format." << std::endl;
        return true;
        }

      if(!cmFortranStreamContainsSequence(finStampFile, seq, seqlen))
        {
        // The stamp must differ if the sequence is not contained.
        return true;
        }
      }
    }
  else if(strcmp(compilerId, "Intel") == 0)
    {
    const char seq[2] = {'\n', '\0'};
    const int seqlen = 2;

    if(!cmFortranStreamContainsSequence(finModFile, seq, seqlen))
      {
      // The module is of unexpected format.  Assume it is different.
      std::cerr << compilerId << " fortran module " << modFile
                << " has unexpected format." << std::endl;
      return true;
      }

    if(!cmFortranStreamContainsSequence(finStampFile, seq, seqlen))
      {
      // The stamp must differ if the sequence is not contained.
      return true;
      }
    }

  // Compare the remaining content.  If no compiler id matched above,
  // including the case none was given, this will compare the whole
  // content.
  if(!cmFortranStreamsDiffer(finModFile, finStampFile))
    {
    return false;
    }

   // The modules are different.
   return true;
}